

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_argument_buffer_padding_sampler_type
          (CompilerMSL *this,SPIRType *struct_type,uint32_t *mbr_idx,uint32_t *arg_buff_index,
          MSLResourceBinding *rez_bind)

{
  Op local_44;
  SPIRType *local_40;
  SPIRType *samp_type;
  MSLResourceBinding *pMStack_30;
  uint32_t samp_type_id;
  MSLResourceBinding *rez_bind_local;
  uint32_t *arg_buff_index_local;
  uint32_t *mbr_idx_local;
  SPIRType *struct_type_local;
  CompilerMSL *this_local;
  
  pMStack_30 = rez_bind;
  rez_bind_local = (MSLResourceBinding *)arg_buff_index;
  arg_buff_index_local = mbr_idx;
  mbr_idx_local = (uint32_t *)struct_type;
  struct_type_local = (SPIRType *)this;
  if (this->argument_buffer_padding_sampler_type_id == 0) {
    samp_type._4_4_ = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    local_44 = OpTypeSampler;
    local_40 = Compiler::set<spirv_cross::SPIRType,spv::Op>
                         ((Compiler *)this,samp_type._4_4_,&local_44);
    local_40->basetype = Sampler;
    local_40->storage = StorageClassUniformConstant;
    this->argument_buffer_padding_sampler_type_id = samp_type._4_4_;
  }
  add_argument_buffer_padding_type
            (this,this->argument_buffer_padding_sampler_type_id,(SPIRType *)mbr_idx_local,
             arg_buff_index_local,&rez_bind_local->stage,pMStack_30->count);
  return;
}

Assistant:

void CompilerMSL::add_argument_buffer_padding_sampler_type(SPIRType &struct_type, uint32_t &mbr_idx,
                                                           uint32_t &arg_buff_index, MSLResourceBinding &rez_bind)
{
	if (!argument_buffer_padding_sampler_type_id)
	{
		uint32_t samp_type_id = ir.increase_bound_by(1);
		auto &samp_type = set<SPIRType>(samp_type_id, OpTypeSampler);
		samp_type.basetype = SPIRType::Sampler;
		samp_type.storage = StorageClassUniformConstant;

		argument_buffer_padding_sampler_type_id = samp_type_id;
	}

	add_argument_buffer_padding_type(argument_buffer_padding_sampler_type_id, struct_type, mbr_idx, arg_buff_index, rez_bind.count);
}